

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

DecodeStatus DecodeMemMMImm4(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  MCRegisterClass *pMVar3;
  ulong Val;
  uint uVar4;
  
  uVar4 = Insn >> 7 & 7;
  uVar1 = MCInst_getOpcode(Inst);
  if ((int)uVar1 < 0x58f) {
    if (((uVar1 - 0x39b < 0x3c) &&
        (Decoder = (MCRegisterInfo *)0x800000080000001,
        (0x800000080000001U >> ((ulong)(uVar1 - 0x39b) & 0x3f) & 1) != 0)) &&
       (DVar2 = DecodeGPRMM16RegisterClass(Inst,uVar4,Address,(MCRegisterInfo *)0x800000080000001),
       DVar2 == MCDisassembler_Fail)) {
      return MCDisassembler_Fail;
    }
  }
  else if (((uVar1 == 0x58f) || (uVar1 == 0x5bb)) || (uVar1 == 0x66c)) {
    pMVar3 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,0x14);
    Decoder = (MCRegisterInfo *)(ulong)uVar4;
    MCOperand_CreateReg0(Inst,(uint)pMVar3->RegsBegin[(long)Decoder]);
  }
  DVar2 = DecodeGPRMM16RegisterClass(Inst,Insn >> 4 & 7,Address,Decoder);
  if (DVar2 == MCDisassembler_Fail) {
    return MCDisassembler_Fail;
  }
  uVar4 = Insn & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  if ((int)uVar1 < 0x58f) {
    if (uVar1 == 0x39b) {
      Val = 0xffffffffffffffff;
      if (uVar4 != 0xf) {
        Val = (ulong)uVar4;
      }
      goto LAB_00221587;
    }
    if (uVar1 == 0x3ba) {
LAB_0022156f:
      Val = (ulong)(uVar4 * 2);
      goto LAB_00221587;
    }
    if (uVar1 != 0x3d6) {
      return MCDisassembler_Success;
    }
  }
  else {
    if (uVar1 == 0x58f) {
      Val = (ulong)uVar4;
      goto LAB_00221587;
    }
    if (uVar1 == 0x5bb) goto LAB_0022156f;
    if (uVar1 != 0x66c) {
      return MCDisassembler_Success;
    }
  }
  Val = (ulong)(uVar4 << 2);
LAB_00221587:
  MCOperand_CreateImm0(Inst,Val);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMemMMImm4(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Offset = Insn & 0xf;
	unsigned Reg = fieldFromInstruction(Insn, 7, 3);
	unsigned Base = fieldFromInstruction(Insn, 4, 3);

	switch (MCInst_getOpcode(Inst)) {
		case Mips_LBU16_MM:
		case Mips_LHU16_MM:
		case Mips_LW16_MM:
			if (DecodeGPRMM16RegisterClass(Inst, Reg, Address, Decoder)
					== MCDisassembler_Fail)
				return MCDisassembler_Fail;
			break;
		case Mips_SB16_MM:
		case Mips_SH16_MM:
		case Mips_SW16_MM:
			if (DecodeGPRMM16ZeroRegisterClass(Inst, Reg, Address, Decoder)
					== MCDisassembler_Fail)
				return MCDisassembler_Fail;
			break;
	}

	if (DecodeGPRMM16RegisterClass(Inst, Base, Address, Decoder)
			== MCDisassembler_Fail)
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		case Mips_LBU16_MM:
			if (Offset == 0xf)
				MCOperand_CreateImm0(Inst, -1);
			else
				MCOperand_CreateImm0(Inst, Offset);
			break;
		case Mips_SB16_MM:
			MCOperand_CreateImm0(Inst, Offset);
			break;
		case Mips_LHU16_MM:
		case Mips_SH16_MM:
			MCOperand_CreateImm0(Inst, Offset << 1);
			break;
		case Mips_LW16_MM:
		case Mips_SW16_MM:
			MCOperand_CreateImm0(Inst, Offset << 2);
			break;
	}

	return MCDisassembler_Success;
}